

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyRoomListView.cpp
# Opt level: O0

void __thiscall EmptyRoomListView::display(EmptyRoomListView *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  Controller *this_00;
  View *pVVar4;
  allocator local_51;
  string local_50;
  Room *local_30;
  Room *room;
  iterator __end1;
  iterator __begin1;
  vector<Room,_std::allocator<Room>_> *__range1;
  EmptyRoomListView *this_local;
  
  getParams(this);
  iVar2 = (*(this->super_ListView<Room>).super_MultipleObjectMixin<Room>.super_Model<Room>.
            _vptr_Model[2])();
  __end1 = std::vector<Room,_std::allocator<Room>_>::begin
                     ((vector<Room,_std::allocator<Room>_> *)CONCAT44(extraout_var,iVar2));
  room = (Room *)std::vector<Room,_std::allocator<Room>_>::end
                           ((vector<Room,_std::allocator<Room>_> *)CONCAT44(extraout_var,iVar2));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Room_*,_std::vector<Room,_std::allocator<Room>_>_>
                                *)&room);
    if (!bVar1) break;
    local_30 = __gnu_cxx::__normal_iterator<Room_*,_std::vector<Room,_std::allocator<Room>_>_>::
               operator*(&__end1);
    poVar3 = std::operator<<((ostream *)&std::cout,"Room #");
    iVar2 = Room::getRoomNumber(local_30);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,", ID: ");
    iVar2 = Model<Room>::getId(&local_30->super_Model<Room>);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"\n");
    __gnu_cxx::__normal_iterator<Room_*,_std::vector<Room,_std::allocator<Room>_>_>::operator++
              (&__end1);
  }
  this_00 = Controller::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"faculty-panel",&local_51);
  pVVar4 = Controller::getView(this_00,&local_50);
  View::response->view = pVVar4;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void EmptyRoomListView::display() {
    getParams();
    for (auto &room : getQueryset()) {
        cout << "Room #" << room.getRoomNumber() << ", ID: " << room.getId() << "\n";
    }
    response->view = Controller::getInstance().getView("faculty-panel");
}